

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::MapFieldGenerator::FinishInitialization
          (MapFieldGenerator *this)

{
  ObjectiveCType OVar1;
  Descriptor *this_00;
  FieldDescriptor *field;
  mapped_type *pmVar2;
  pointer this_01;
  allocator local_139;
  key_type local_138;
  string local_118;
  allocator local_f1;
  key_type local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  allocator local_39;
  string local_38;
  FieldDescriptor *local_18;
  FieldDescriptor *value_descriptor;
  MapFieldGenerator *this_local;
  
  value_descriptor = (FieldDescriptor *)this;
  RepeatedFieldGenerator::FinishInitialization(&this->super_RepeatedFieldGenerator);
  this_00 = FieldDescriptor::message_type
                      ((this->super_RepeatedFieldGenerator).super_ObjCObjFieldGenerator.
                       super_SingleFieldGenerator.super_FieldGenerator.descriptor_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"value",&local_39);
  field = Descriptor::FindFieldByName(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_18 = field;
  OVar1 = GetObjectiveCType(field);
  if (OVar1 == OBJECTIVECTYPE_ENUM) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_f0,"name",&local_f1);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&(this->super_RepeatedFieldGenerator).super_ObjCObjFieldGenerator.
                           super_SingleFieldGenerator.super_FieldGenerator.variables_,&local_f0);
    std::operator+(&local_d0,"// |",pmVar2);
    std::operator+(&local_b0,&local_d0,"| values are |");
    this_01 = std::
              unique_ptr<google::protobuf::compiler::objectivec::FieldGenerator,_std::default_delete<google::protobuf::compiler::objectivec::FieldGenerator>_>
              ::operator->(&this->value_field_generator_);
    FieldGenerator::variable_abi_cxx11_(&local_118,this_01,"storage_type");
    std::operator+(&local_90,&local_b0,&local_118);
    std::operator+(&local_70,&local_90,"|\n");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_138,"array_comment",&local_139);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&(this->super_RepeatedFieldGenerator).super_ObjCObjFieldGenerator.
                           super_SingleFieldGenerator.super_FieldGenerator.variables_,&local_138);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  }
  return;
}

Assistant:

void MapFieldGenerator::FinishInitialization(void) {
  RepeatedFieldGenerator::FinishInitialization();
  // Use the array_comment support in RepeatedFieldGenerator to output what the
  // values in the map are.
  const FieldDescriptor* value_descriptor =
      descriptor_->message_type()->FindFieldByName("value");
  if (GetObjectiveCType(value_descriptor) == OBJECTIVECTYPE_ENUM) {
    variables_["array_comment"] =
        "// |" + variables_["name"] + "| values are |" + value_field_generator_->variable("storage_type") + "|\n";
  }
}